

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O1

string * SleighArchitecture::normalizeSize(string *__return_storage_ptr__,string *nm)

{
  pointer pcVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (nm->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + nm->_M_string_length);
  uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x34c4b8,0);
  if (uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar2);
  }
  uVar2 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2d);
  if (uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string SleighArchitecture::normalizeSize(const string &nm)

{
  string res = nm;
  string::size_type pos;
  
  pos = res.find("bit");
  if (pos != string::npos)
    res.erase(pos,3);
  pos = res.find('-');
  if (pos != string::npos)
    res.erase(pos,1);
  return res;
}